

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::createUniqueDirectory(Twine *Prefix,SmallVectorImpl<char> *ResultPath)

{
  error_code eVar1;
  int Dummy;
  Twine local_50;
  Twine local_38;
  
  Twine::Twine(&local_50,"-%%%%%%");
  Twine::concat(&local_38,Prefix,&local_50);
  eVar1 = createUniqueEntity(&local_38,&Dummy,ResultPath,true,0,FS_Dir,F_None);
  return eVar1;
}

Assistant:

std::error_code createUniqueDirectory(const Twine &Prefix,
                                      SmallVectorImpl<char> &ResultPath) {
  int Dummy;
  return createUniqueEntity(Prefix + "-%%%%%%", Dummy, ResultPath, true, 0,
                            FS_Dir);
}